

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPExtImplementationDefinedRequirementClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPExtImplementationDefinedRequirementClause *this)

{
  string ext_user_defined_implementation;
  string parameter_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_30);
  local_30 = local_20;
  local_28 = 0;
  local_20[0] = 0;
  std::__cxx11::string::string
            ((string *)&local_50,(string *)&this->implementation_defined_requirement);
  std::operator+(&local_70,"ext_",&local_50);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPExtImplementationDefinedRequirementClause::toString() {
    std::string result = "";
    std::string parameter_string;

    std::string ext_user_defined_implementation = this->getImplementationDefinedRequirement();
    result += "ext_" + ext_user_defined_implementation;
    result += " ";
    return result;
}